

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void rtreedepth(sqlite3_context *ctx,int nArg,sqlite3_value **apArg)

{
  int iVar1;
  u8 *p;
  u8 *zBlob;
  sqlite3_value **apArg_local;
  int nArg_local;
  sqlite3_context *ctx_local;
  
  iVar1 = sqlite3_value_type(*apArg);
  if ((iVar1 == 4) && (iVar1 = sqlite3_value_bytes(*apArg), 1 < iVar1)) {
    p = (u8 *)sqlite3_value_blob(*apArg);
    iVar1 = readInt16(p);
    sqlite3_result_int(ctx,iVar1);
    return;
  }
  sqlite3_result_error(ctx,"Invalid argument to rtreedepth()",-1);
  return;
}

Assistant:

static void rtreedepth(sqlite3_context *ctx, int nArg, sqlite3_value **apArg){
  UNUSED_PARAMETER(nArg);
  if( sqlite3_value_type(apArg[0])!=SQLITE_BLOB 
   || sqlite3_value_bytes(apArg[0])<2
  ){
    sqlite3_result_error(ctx, "Invalid argument to rtreedepth()", -1); 
  }else{
    u8 *zBlob = (u8 *)sqlite3_value_blob(apArg[0]);
    sqlite3_result_int(ctx, readInt16(zBlob));
  }
}